

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O0

void Wlc_NtkCollectBoxes(Wlc_Ntk_t *p,Vec_Int_t *vBoxIds)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *p_01;
  Vec_Int_t *vBoxes;
  int iObj;
  int i;
  Vec_Int_t *vBoxIds_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Vec_IntSize(vBoxIds);
  p_00 = Vec_IntAlloc(iVar1 + 1);
  iVar1 = Vec_IntSize(vBoxIds);
  Vec_IntPush(p_00,iVar1);
  for (vBoxes._4_4_ = 0; iVar1 = Vec_IntSize(vBoxIds), vBoxes._4_4_ < iVar1;
      vBoxes._4_4_ = vBoxes._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vBoxIds,vBoxes._4_4_);
    iVar1 = Wlc_ObjNameId(p,iVar1);
    Vec_IntPush(p_00,iVar1);
  }
  p_01 = Vec_IntReleaseArray(p_00);
  Abc_FrameSetBoxes(p_01);
  Vec_IntFree(p_00);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collect adds and mults.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkCollectBoxes( Wlc_Ntk_t * p, Vec_Int_t * vBoxIds )
{
    int i, iObj;
    Vec_Int_t * vBoxes = Vec_IntAlloc( Vec_IntSize(vBoxIds) + 1 );
    Vec_IntPush( vBoxes, Vec_IntSize(vBoxIds) );
    Vec_IntForEachEntry( vBoxIds, iObj, i )
        Vec_IntPush( vBoxes, Wlc_ObjNameId(p, iObj) );
    Abc_FrameSetBoxes( Vec_IntReleaseArray(vBoxes) );
    Vec_IntFree( vBoxes );
}